

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void pop_undo_step(void)

{
  size_t sVar1;
  State *pSVar2;
  State local_80;
  
  sVar1 = bas::Stack<State,_4UL,_bas::RawAllocator>::size(&undo_stack);
  if (sVar1 < 2) {
    std::operator<<((ostream *)&std::cout,"End of undo stack\n");
  }
  else {
    bas::Stack<State,_4UL,_bas::RawAllocator>::pop(&local_80,&undo_stack);
    State::~State(&local_80);
    pSVar2 = bas::Stack<State,_4UL,_bas::RawAllocator>::peek(&undo_stack);
    State::operator=(&state,pSVar2);
    std::operator<<((ostream *)&std::cout,"Pop undo step\n");
  }
  return;
}

Assistant:

static void pop_undo_step()
{
    if (undo_stack.size() <= 1) {
        std::cout << "End of undo stack\n";
        return;
    }

    undo_stack.pop();
    state = undo_stack.peek();
    std::cout << "Pop undo step\n";
}